

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase1716::run(TestCase1716 *this)

{
  PointerType PVar1;
  MessageSizeCounts MVar2;
  Builder root;
  MallocMessageBuilder message;
  int local_17c;
  PointerReader local_178;
  StructReader local_158;
  StructBuilder local_128;
  MallocMessageBuilder local_100;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_100,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_178,&local_100.super_MessageBuilder);
  local_158.data = local_178.pointer;
  local_158.segment = local_178.segment;
  local_158.capTable = local_178.capTable;
  PointerBuilder::initStruct(&local_128,(PointerBuilder *)&local_158,(StructSize)0x10000);
  StructBuilder::asReader(&local_128);
  MVar2 = StructReader::totalSize(&local_158);
  if ((MVar2.wordCount != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_17c = 1;
    StructBuilder::asReader(&local_128);
    MVar2 = StructReader::totalSize(&local_158);
    local_178.segment = (SegmentReader *)MVar2.wordCount;
    local_178.capTable = (CapTableReader *)CONCAT44(local_178.capTable._4_4_,MVar2.capCount);
    kj::_::Debug::log<char_const(&)[53],int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x6b8,ERROR,
               "\"failed: expected \" \"(1) == (root.totalSize().wordCount)\", 1, root.totalSize().wordCount"
               ,(char (*) [53])"failed: expected (1) == (root.totalSize().wordCount)",&local_17c,
               (unsigned_long *)&local_178);
  }
  StructBuilder::asReader(&local_128);
  if (local_158.pointerCount == 0) {
    local_178.segment = (SegmentReader *)0x0;
    local_178.capTable = (CapTableReader *)0x0;
    local_178.pointer = (WirePointer *)0x0;
    local_178.nestingLimit = 0x7fffffff;
  }
  else {
    local_178.segment = local_158.segment;
    local_178.capTable = local_158.capTable;
    local_178.pointer = local_158.pointers;
    local_178.nestingLimit = local_158.nestingLimit;
  }
  PVar1 = PointerReader::getPointerType(&local_178);
  if ((PVar1 != NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[57]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x6ba,ERROR,"\"failed: expected \" \"!(root.asReader().hasAnyPointerField())\"",
               (char (*) [57])"failed: expected !(root.asReader().hasAnyPointerField())");
  }
  local_158.segment = &(local_128.segment)->super_SegmentReader;
  local_158.capTable = &(local_128.capTable)->super_CapTableReader;
  local_158.data = local_128.pointers;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_158);
  if ((PVar1 != NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[46]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x6bb,ERROR,"\"failed: expected \" \"!(root.hasAnyPointerField())\"",
               (char (*) [46])"failed: expected !(root.hasAnyPointerField())");
  }
  local_178.segment = &(local_128.segment)->super_SegmentReader;
  local_178.capTable = &(local_128.capTable)->super_CapTableReader;
  local_178.pointer = local_128.pointers;
  PointerBuilder::initStruct
            ((StructBuilder *)&local_158,(PointerBuilder *)&local_178,(StructSize)0x0);
  StructBuilder::asReader(&local_128);
  if (local_158.pointerCount == 0) {
    local_178.segment = (SegmentReader *)0x0;
    local_178.capTable = (CapTableReader *)0x0;
    local_178.pointer = (WirePointer *)0x0;
    local_158.nestingLimit = 0x7fffffff;
  }
  else {
    local_178.segment = local_158.segment;
    local_178.capTable = local_158.capTable;
    local_178.pointer = local_158.pointers;
  }
  local_178.nestingLimit = local_158.nestingLimit;
  PVar1 = PointerReader::getPointerType(&local_178);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[54]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x6bd,ERROR,"\"failed: expected \" \"root.asReader().hasAnyPointerField()\"",
               (char (*) [54])"failed: expected root.asReader().hasAnyPointerField()");
  }
  local_158.segment = &(local_128.segment)->super_SegmentReader;
  local_158.capTable = &(local_128.capTable)->super_CapTableReader;
  local_158.data = local_128.pointers;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_158);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[43]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x6be,ERROR,"\"failed: expected \" \"root.hasAnyPointerField()\"",
               (char (*) [43])"failed: expected root.hasAnyPointerField()");
  }
  StructBuilder::asReader(&local_128);
  MVar2 = StructReader::totalSize(&local_158);
  if ((MVar2.wordCount != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_17c = 1;
    StructBuilder::asReader(&local_128);
    MVar2 = StructReader::totalSize(&local_158);
    local_178.segment = (SegmentReader *)MVar2.wordCount;
    local_178.capTable = (CapTableReader *)CONCAT44(local_178.capTable._4_4_,MVar2.capCount);
    kj::_::Debug::log<char_const(&)[53],int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x6c0,ERROR,
               "\"failed: expected \" \"(1) == (root.totalSize().wordCount)\", 1, root.totalSize().wordCount"
               ,(char (*) [53])"failed: expected (1) == (root.totalSize().wordCount)",&local_17c,
               (unsigned_long *)&local_178);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_100);
  return;
}

Assistant:

TEST(Encoding, HasEmptyStruct) {
  MallocMessageBuilder message;
  auto root = message.initRoot<test::TestAnyPointer>();

  EXPECT_EQ(1, root.totalSize().wordCount);

  EXPECT_FALSE(root.asReader().hasAnyPointerField());
  EXPECT_FALSE(root.hasAnyPointerField());
  root.getAnyPointerField().initAs<test::TestEmptyStruct>();
  EXPECT_TRUE(root.asReader().hasAnyPointerField());
  EXPECT_TRUE(root.hasAnyPointerField());

  EXPECT_EQ(1, root.totalSize().wordCount);
}